

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O1

TRef narrow_stripov(jit_State *J,TRef tr,int lastop,IRRef mode)

{
  byte bVar1;
  ushort uVar2;
  IRIns *pIVar3;
  IRRef1 IVar4;
  bool bVar5;
  TRef TVar6;
  TRef TVar7;
  ulong uVar8;
  undefined4 in_register_00000014;
  long lVar9;
  long lVar10;
  uint uVar11;
  
  IVar4 = (IRRef1)tr;
  uVar8 = (ulong)tr & 0xffff;
  pIVar3 = (J->cur).ir;
  bVar1 = *(byte *)((long)pIVar3 + uVar8 * 8 + 5);
  uVar11 = (uint)bVar1;
  lVar9 = CONCAT71((int7)(CONCAT44(in_register_00000014,lastop) >> 8),uVar11 < 0x35);
  if (lastop < (int)uVar11 || uVar11 < 0x35) {
    if (((mode >> 0xb & 1) != 0) &&
       ((0x604208U >> (*(uint *)((long)pIVar3 + uVar8 * 8 + 4) & 0x1f) & 1) == 0)) {
      (J->fold).ins.field_0.ot = 0x5515;
      (J->fold).ins.field_0.op1 = IVar4;
      (J->fold).ins.field_0.op2 = (IRRef1)mode;
      TVar6 = lj_opt_fold(J);
      return TVar6;
    }
  }
  else {
    lVar10 = 0x8b8;
    do {
      if (((*(IRRef1 *)((long)&(J->cur).nextgc.gcptr32 + lVar10) == IVar4) &&
          (uVar11 = *(uint *)(&(J->cur).marked + lVar10), mode <= uVar11)) &&
         (((uVar11 ^ mode) & 0xfff) == 0)) {
        lVar9 = (long)&(J->cur).nextgc.gcptr32 + lVar10;
        bVar5 = false;
      }
      else {
        bVar5 = true;
      }
      if (!bVar5) goto LAB_00135e57;
      lVar10 = lVar10 + 8;
    } while (lVar10 != 0x938);
    lVar9 = 0;
LAB_00135e57:
    if (lVar9 == 0) {
      uVar2 = *(ushort *)((long)pIVar3 + uVar8 * 8 + 2);
      TVar6 = narrow_stripov(J,(uint)pIVar3[uVar8].field_0.op1,lastop,mode);
      TVar7 = narrow_stripov(J,(uint)uVar2,lastop,mode);
      (J->fold).ins.field_0.ot = (((ushort)(mode >> 5) & 0x1f) + (ushort)bVar1 * 0x100) - 0xd00;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar6;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
      tr = lj_opt_fold(J);
      uVar11 = J->bpropslot;
      J->bpropslot = uVar11 + 1 & 0xf;
      J->bpropcache[uVar11].key = IVar4;
      J->bpropcache[uVar11].val = (IRRef1)tr;
      J->bpropcache[uVar11].mode = mode;
    }
    else {
      tr = *(int *)((long)pIVar3 + (ulong)*(ushort *)(lVar9 + 2) * 8 + 4) << 0x18 |
           (uint)*(ushort *)(lVar9 + 2);
    }
  }
  return tr;
}

Assistant:

static TRef narrow_stripov(jit_State *J, TRef tr, int lastop, IRRef mode)
{
  IRRef ref = tref_ref(tr);
  IRIns *ir = IR(ref);
  int op = ir->o;
  if (op >= IR_ADDOV && op <= lastop) {
    BPropEntry *bp = narrow_bpc_get(J, ref, mode);
    if (bp) {
      return TREF(bp->val, irt_t(IR(bp->val)->t));
    } else {
      IRRef op1 = ir->op1, op2 = ir->op2;  /* The IR may be reallocated. */
      op1 = narrow_stripov(J, op1, lastop, mode);
      op2 = narrow_stripov(J, op2, lastop, mode);
      tr = emitir(IRT(op - IR_ADDOV + IR_ADD,
		      ((mode & IRCONV_DSTMASK) >> IRCONV_DSH)), op1, op2);
      narrow_bpc_set(J, ref, tref_ref(tr), mode);
    }
  } else if (LJ_64 && (mode & IRCONV_SEXT) && !irt_is64(ir->t)) {
    tr = emitir(IRT(IR_CONV, IRT_INTP), tr, mode);
  }
  return tr;
}